

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool __thiscall USDFParser::ParseIfItem(USDFParser *this,FStrifeDialogueNode *node)

{
  bool bVar1;
  PClassActor *p;
  FName key;
  FStrifeDialogueItemCheck check;
  
  check.Item = (PClassInventory *)0x0;
  check.Amount = -1;
  while( true ) {
    bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (bVar1) break;
    UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
    if (key.Index == 0x1e9) {
      check.Amount = UDMFParserBase::CheckInt
                               (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e9].Text);
    }
    else if (key.Index == 0x29) {
      p = CheckActorType(this,FName::NameData.NameArray[0x29].Text);
      check.Item = dyn_cast<PClassInventory>((DObject *)p);
    }
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Push(&node->ItemCheck,&check);
  return true;
}

Assistant:

bool ParseIfItem(FStrifeDialogueNode *node)
	{
		FStrifeDialogueItemCheck check;
		check.Item = NULL;
		check.Amount = -1;

		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Item:
				check.Item = dyn_cast<PClassInventory>(CheckActorType(key));
				break;

			case NAME_Count:
				// Not yet implemented in the engine. Todo later
				check.Amount = CheckInt(key);
				break;
			}
		}

		node->ItemCheck.Push(check);
		return true;
	}